

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O0

uint64_t __thiscall fast_float::bigint::hi64(bigint *this,bool *truncated)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  size_t sVar6;
  ulong *puVar7;
  int __c;
  int __c_00;
  byte *in_RSI;
  stackvec<(unsigned_short)62> *in_RDI;
  uint64_t result;
  int shl;
  int shr;
  int shl_1;
  undefined8 local_60;
  undefined8 local_10;
  
  sVar6 = stackvec<(unsigned_short)62>::len(in_RDI);
  if (sVar6 == 0) {
    *in_RSI = 0;
    local_60 = (stackvec<(unsigned_short)62> *)0x0;
  }
  else {
    sVar6 = stackvec<(unsigned_short)62>::len(in_RDI);
    if (sVar6 == 1) {
      puVar7 = (ulong *)stackvec<(unsigned_short)62>::rindex(in_RDI,(char *)0x0,__c);
      uVar1 = *puVar7;
      *in_RSI = 0;
      lVar2 = 0x3f;
      if (uVar1 != 0) {
        for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      local_60 = (stackvec<(unsigned_short)62> *)(uVar1 << (((byte)lVar2 ^ 0x3f) & 0x3f));
    }
    else {
      puVar7 = (ulong *)stackvec<(unsigned_short)62>::rindex(in_RDI,(char *)0x0,__c);
      local_10 = (stackvec<(unsigned_short)62> *)*puVar7;
      puVar7 = (ulong *)stackvec<(unsigned_short)62>::rindex(in_RDI,(char *)0x1,__c_00);
      uVar1 = *puVar7;
      lVar2 = 0x3f;
      if (local_10 != (stackvec<(unsigned_short)62> *)0x0) {
        for (; (ulong)local_10 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar5 = (uint)lVar2 ^ 0x3f;
      if (uVar5 == 0) {
        *in_RSI = uVar1 != 0;
      }
      else {
        bVar3 = (byte)uVar5;
        *in_RSI = uVar1 << (bVar3 & 0x3f) != 0;
        local_10 = (stackvec<(unsigned_short)62> *)
                   ((long)local_10 << (bVar3 & 0x3f) | uVar1 >> (0x40 - bVar3 & 0x3f));
      }
      bVar4 = stackvec<(unsigned_short)62>::nonzero(local_10,(size_t)in_RDI);
      *in_RSI = (*in_RSI & 1) != 0 || bVar4;
      local_60 = local_10;
    }
  }
  return (uint64_t)local_60;
}

Assistant:

uint64_t hi64(bool& truncated) const noexcept {
#ifdef FASTFLOAT_64BIT_LIMB
    if (vec.len() == 0) {
      return empty_hi64(truncated);
    } else if (vec.len() == 1) {
      return uint64_hi64(vec.rindex(0), truncated);
    } else {
      uint64_t result = uint64_hi64(vec.rindex(0), vec.rindex(1), truncated);
      truncated |= vec.nonzero(2);
      return result;
    }
#else
    if (vec.len() == 0) {
      return empty_hi64(truncated);
    } else if (vec.len() == 1) {
      return uint32_hi64(vec.rindex(0), truncated);
    } else if (vec.len() == 2) {
      return uint32_hi64(vec.rindex(0), vec.rindex(1), truncated);
    } else {
      uint64_t result = uint32_hi64(vec.rindex(0), vec.rindex(1), vec.rindex(2), truncated);
      truncated |= vec.nonzero(3);
      return result;
    }
#endif
  }